

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pac_id.cc
# Opt level: O0

bool __thiscall Env::GetConstant(Env *this,ID *id,int *pc)

{
  IDRecord *this_00;
  int *in_RDX;
  IDRecord *r;
  undefined1 local_1;
  
  this_00 = lookup(this,id,pc._7_1_,pc._6_1_);
  if (this_00 == (IDRecord *)0x0) {
    local_1 = false;
  }
  else {
    local_1 = IDRecord::GetConstant(this_00,in_RDX);
  }
  return local_1;
}

Assistant:

bool Env::GetConstant(const ID* id, int* pc) const
	{
	ASSERT(pc);
	// lookup without raising exception
	IDRecord* r = lookup(id, true, false);
	if ( r )
		return r->GetConstant(pc);
	else
		return false;
	}